

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_info.c
# Opt level: O0

void info_print_flags(lyout *out,uint16_t flags,uint16_t mask,int is_list)

{
  int is_list_local;
  uint16_t mask_local;
  uint16_t flags_local;
  lyout *out_local;
  
  if ((mask & 3) != 0) {
    ly_print(out,"%-*s",0xb,"Config: ");
    if ((flags & 2) == 0) {
      ly_print(out,"read-write\n");
    }
    else {
      ly_print(out,"read-only\n");
    }
  }
  if ((mask & 0x38) != 0) {
    ly_print(out,"%-*s",0xb,"Status: ");
    if ((flags & 0x10) == 0) {
      if ((flags & 0x20) == 0) {
        ly_print(out,"current\n");
      }
      else {
        ly_print(out,"obsolete\n");
      }
    }
    else {
      ly_print(out,"deprecated\n");
    }
  }
  if ((mask & 0xc0) != 0) {
    ly_print(out,"%-*s",0xb,"Mandatory: ");
    if ((flags & 0x40) == 0) {
      ly_print(out,"no\n");
    }
    else {
      ly_print(out,"yes\n");
    }
  }
  if ((is_list != 0) && ((mask & 0x100) != 0)) {
    ly_print(out,"%-*s",0xb,"Order: ");
    if ((flags & 0x100) == 0) {
      ly_print(out,"system-ordered\n");
    }
    else {
      ly_print(out,"user-ordered\n");
    }
  }
  if ((is_list == 0) && ((mask & 0x100) != 0)) {
    ly_print(out,"%-*s",0xb,"Enabled: ");
    if ((flags & 0x100) == 0) {
      ly_print(out,"no\n");
    }
    else {
      ly_print(out,"yes\n");
    }
  }
  return;
}

Assistant:

static void
info_print_flags(struct lyout *out, uint16_t flags, uint16_t mask, int is_list)
{
    if (mask & LYS_CONFIG_MASK) {
        ly_print(out, "%-*s", INDENT_LEN, "Config: ");
        if (flags & LYS_CONFIG_R) {
            ly_print(out, "read-only\n");
        } else {
            ly_print(out, "read-write\n");
        }
    }

    if (mask & LYS_STATUS_MASK) {
        ly_print(out, "%-*s", INDENT_LEN, "Status: ");

        if (flags & LYS_STATUS_DEPRC) {
            ly_print(out, "deprecated\n");
        } else if (flags & LYS_STATUS_OBSLT) {
            ly_print(out, "obsolete\n");
        } else {
            ly_print(out, "current\n");
        }
    }

    if (mask & LYS_MAND_MASK) {
        ly_print(out, "%-*s", INDENT_LEN, "Mandatory: ");

        if (flags & LYS_MAND_TRUE) {
            ly_print(out, "yes\n");
        } else {
            ly_print(out, "no\n");
        }
    }

    if (is_list && (mask & LYS_USERORDERED)) {
        ly_print(out, "%-*s", INDENT_LEN, "Order: ");

        if (flags & LYS_USERORDERED) {
            ly_print(out, "user-ordered\n");
        } else {
            ly_print(out, "system-ordered\n");
        }
    }

    if (!is_list && (mask & LYS_FENABLED)) {
        ly_print(out, "%-*s", INDENT_LEN, "Enabled: ");

        if (flags & LYS_FENABLED) {
            ly_print(out, "yes\n");
        } else {
            ly_print(out, "no\n");
        }
    }
}